

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O0

void __thiscall Hair_HOnTheEdge_Test::~Hair_HOnTheEdge_Test(Hair_HOnTheEdge_Test *this)

{
  void *in_RDI;
  
  ~Hair_HOnTheEdge_Test((Hair_HOnTheEdge_Test *)0x4ff808);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Hair, HOnTheEdge) {
    Vector3f wo(0.54986966, 0.03359017, 0.83457476),
        wi(-0.37383357, -0.91920084, 0.12376696);
    Float h = -1, beta_m = .1, beta_n = .1;
    SampledSpectrum sigma_a(0.f);
    HairBxDF hair(h, 1.55, sigma_a, beta_m, beta_n, 0.f);

    SampledSpectrum f = hair.f(wo, wi, TransportMode::Radiance);
}